

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,string *base58_data,ByteData256 *tweak_sum)

{
  ByteData256 *chaincode;
  ByteData *this_00;
  uint32_t *this_01;
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ByteData256 *tweak_sum_local;
  string *base58_data_local;
  ExtPubkey *this_local;
  
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Pubkey::Pubkey(&this->pubkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x44735d);
  chaincode = &this->chaincode_;
  this_01 = &this->fingerprint_;
  this_00 = (ByteData *)0x0;
  AnalyzeBip32KeyData((void *)0x0,base58_data,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                      &this->version_,&this->depth_,&this->child_num_,chaincode,(Privkey *)0x0,
                      &this->pubkey_,this_01);
  ByteData::ByteData(&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  ByteData::operator=(this_00,(ByteData *)chaincode);
  ByteData::~ByteData((ByteData *)0x4473e3);
  ByteData256::operator=(&this->tweak_sum_,tweak_sum);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    const std::string& base58_data, const ByteData256& tweak_sum) {
  std::vector<uint8_t> data;
  AnalyzeBip32KeyData(
      nullptr, &base58_data, &data, &version_, &depth_, &child_num_,
      &chaincode_, nullptr, &pubkey_, &fingerprint_);
  serialize_data_ = ByteData(data);
  tweak_sum_ = tweak_sum;
}